

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O0

ngx_int_t ngx_http_charset_body_filter(ngx_http_request_t *r,ngx_chain_t *in)

{
  ngx_http_charset_ctx_t *ctx_00;
  u_char *puVar1;
  ngx_buf_t *pnVar2;
  ngx_chain_t *pnVar3;
  long local_60;
  long local_58;
  ngx_http_charset_ctx_t *ctx;
  ngx_chain_t **ll;
  ngx_chain_t *out;
  ngx_chain_t *cl;
  ngx_buf_t *b;
  ngx_int_t rc;
  ngx_chain_t *in_local;
  ngx_http_request_t *r_local;
  
  ctx_00 = (ngx_http_charset_ctx_t *)r->ctx[ngx_http_charset_filter_module.ctx_index];
  rc = (ngx_int_t)in;
  in_local = (ngx_chain_t *)r;
  if ((ctx_00 == (ngx_http_charset_ctx_t *)0x0) || (ctx_00->table == (u_char *)0x0)) {
    r_local = (ngx_http_request_t *)(*ngx_http_next_body_filter)(r,in);
  }
  else {
    out = in;
    if ((((*(uint *)&ctx_00->field_0x44 >> 0x11 & 1) == 0) &&
        ((*(uint *)&ctx_00->field_0x44 >> 0x10 & 1) == 0)) && (ctx_00->busy == (ngx_chain_t *)0x0))
    {
      for (; out != (ngx_chain_t *)0x0; out = out->next) {
        ngx_http_charset_recode(out->buf,ctx_00->table);
      }
      r_local = (ngx_http_request_t *)
                (*ngx_http_next_body_filter)((ngx_http_request_t *)in_local,(ngx_chain_t *)rc);
    }
    else {
      ll = (ngx_chain_t **)0x0;
      ctx = (ngx_http_charset_ctx_t *)&ll;
      for (; out != (ngx_chain_t *)0x0; out = out->next) {
        cl = (ngx_chain_t *)out->buf;
        if ((((*(ushort *)&((ngx_buf_t *)cl)->field_0x48 & 1) == 0) &&
            ((*(ushort *)&((ngx_buf_t *)cl)->field_0x48 >> 1 & 1) == 0)) &&
           ((*(ushort *)&((ngx_buf_t *)cl)->field_0x48 >> 2 & 1) == 0)) {
          local_58 = ((ngx_buf_t *)cl)->file_last - ((ngx_buf_t *)cl)->file_pos;
        }
        else {
          local_58 = (long)((ngx_buf_t *)cl)->last - (long)((ngx_buf_t *)cl)->pos;
        }
        if (local_58 == 0) {
          pnVar3 = ngx_alloc_chain_link((ngx_pool_t *)in_local[5].next);
          ctx->table = (u_char *)pnVar3;
          if (ctx->table == (u_char *)0x0) {
            return -1;
          }
          *(ngx_chain_t **)ctx->table = cl;
          puVar1 = ctx->table;
          puVar1[8] = '\0';
          puVar1[9] = '\0';
          puVar1[10] = '\0';
          puVar1[0xb] = '\0';
          puVar1[0xc] = '\0';
          puVar1[0xd] = '\0';
          puVar1[0xe] = '\0';
          puVar1[0xf] = '\0';
          ctx = (ngx_http_charset_ctx_t *)(ctx->table + 8);
        }
        else {
          if ((*(uint *)&ctx_00->field_0x44 >> 0x11 & 1) == 0) {
            pnVar3 = ngx_http_charset_recode_from_utf8
                               ((ngx_pool_t *)in_local[5].next,(ngx_buf_t *)cl,ctx_00);
            ctx->table = (u_char *)pnVar3;
          }
          else {
            pnVar3 = ngx_http_charset_recode_to_utf8
                               ((ngx_pool_t *)in_local[5].next,(ngx_buf_t *)cl,ctx_00);
            ctx->table = (u_char *)pnVar3;
          }
          if (ctx->table == (u_char *)0x0) {
            return -1;
          }
          for (; ctx->table != (u_char *)0x0; ctx = (ngx_http_charset_ctx_t *)(ctx->table + 8)) {
          }
        }
      }
      r_local = (ngx_http_request_t *)
                (*ngx_http_next_body_filter)((ngx_http_request_t *)in_local,(ngx_chain_t *)ll);
      if (ll != (ngx_chain_t **)0x0) {
        if (ctx_00->busy == (ngx_chain_t *)0x0) {
          ctx_00->busy = (ngx_chain_t *)ll;
        }
        else {
          for (out = ctx_00->busy; out->next != (ngx_chain_t *)0x0; out = out->next) {
          }
          out->next = (ngx_chain_t *)ll;
        }
      }
      while (ctx_00->busy != (ngx_chain_t *)0x0) {
        pnVar3 = ctx_00->busy;
        pnVar2 = pnVar3->buf;
        if ((((*(ushort *)&pnVar2->field_0x48 & 1) == 0) &&
            ((*(ushort *)&pnVar2->field_0x48 >> 1 & 1) == 0)) &&
           ((*(ushort *)&pnVar2->field_0x48 >> 2 & 1) == 0)) {
          local_60 = pnVar2->file_last - pnVar2->file_pos;
        }
        else {
          local_60 = (long)pnVar2->last - (long)pnVar2->pos;
        }
        if (local_60 != 0) {
          return (ngx_int_t)r_local;
        }
        ctx_00->busy = pnVar3->next;
        if ((ngx_module_t *)pnVar2->tag == &ngx_http_charset_filter_module) {
          if (pnVar2->shadow != (ngx_buf_t *)0x0) {
            pnVar2->shadow->pos = pnVar2->shadow->last;
          }
          if (pnVar2->pos == (u_char *)0x0) {
            pnVar3->next = ctx_00->free_bufs;
            ctx_00->free_bufs = pnVar3;
          }
          else {
            pnVar3->next = ctx_00->free_buffers;
            ctx_00->free_buffers = pnVar3;
          }
        }
      }
    }
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_charset_body_filter(ngx_http_request_t *r, ngx_chain_t *in)
{
    ngx_int_t                rc;
    ngx_buf_t               *b;
    ngx_chain_t             *cl, *out, **ll;
    ngx_http_charset_ctx_t  *ctx;

    ctx = ngx_http_get_module_ctx(r, ngx_http_charset_filter_module);

    if (ctx == NULL || ctx->table == NULL) {
        return ngx_http_next_body_filter(r, in);
    }

    if ((ctx->to_utf8 || ctx->from_utf8) || ctx->busy) {

        out = NULL;
        ll = &out;

        for (cl = in; cl; cl = cl->next) {
            b = cl->buf;

            if (ngx_buf_size(b) == 0) {

                *ll = ngx_alloc_chain_link(r->pool);
                if (*ll == NULL) {
                    return NGX_ERROR;
                }

                (*ll)->buf = b;
                (*ll)->next = NULL;

                ll = &(*ll)->next;

                continue;
            }

            if (ctx->to_utf8) {
                *ll = ngx_http_charset_recode_to_utf8(r->pool, b, ctx);

            } else {
                *ll = ngx_http_charset_recode_from_utf8(r->pool, b, ctx);
            }

            if (*ll == NULL) {
                return NGX_ERROR;
            }

            while (*ll) {
                ll = &(*ll)->next;
            }
        }

        rc = ngx_http_next_body_filter(r, out);

        if (out) {
            if (ctx->busy == NULL) {
                ctx->busy = out;

            } else {
                for (cl = ctx->busy; cl->next; cl = cl->next) { /* void */ }
                cl->next = out;
            }
        }

        while (ctx->busy) {

            cl = ctx->busy;
            b = cl->buf;

            if (ngx_buf_size(b) != 0) {
                break;
            }

            ctx->busy = cl->next;

            if (b->tag != (ngx_buf_tag_t) &ngx_http_charset_filter_module) {
                continue;
            }

            if (b->shadow) {
                b->shadow->pos = b->shadow->last;
            }

            if (b->pos) {
                cl->next = ctx->free_buffers;
                ctx->free_buffers = cl;
                continue;
            }

            cl->next = ctx->free_bufs;
            ctx->free_bufs = cl;
        }

        return rc;
    }

    for (cl = in; cl; cl = cl->next) {
        (void) ngx_http_charset_recode(cl->buf, ctx->table);
    }

    return ngx_http_next_body_filter(r, in);
}